

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLineOrder.cpp
# Opt level: O0

void testLineOrder(string *tempDir)

{
  byte bVar1;
  ostream *poVar2;
  void *this;
  exception *e;
  int lorder;
  string filename;
  int n;
  int maxThreads;
  Array2D<Imath_3_2::half> ph;
  int H;
  int W;
  LineOrder in_stack_0000033c;
  int in_stack_00000340;
  int in_stack_00000344;
  char *in_stack_00000348;
  Array2D<Imath_3_2::half> *in_stack_00000350;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Array2D<Imath_3_2::half> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  int local_64;
  string local_60 [32];
  int local_40;
  int local_3c;
  undefined4 local_1c;
  undefined4 local_18;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing line order and random access to scan lines");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_18 = 0x75;
  local_1c = 0x61;
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
             ,(long)in_stack_ffffffffffffff50);
  anon_unknown.dwarf_13deeb::fillPixels
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  bVar1 = IlmThread_3_2::supportsThreads();
  local_3c = 0;
  if ((bVar1 & 1) != 0) {
    local_3c = 3;
  }
  for (local_40 = 0; local_40 <= local_3c; local_40 = local_40 + 1) {
    bVar1 = IlmThread_3_2::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_3_2::setGlobalThreadCount(local_40);
      in_stack_ffffffffffffff78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      in_stack_ffffffffffffff74 = Imf_3_2::globalThreadCount();
      this = (void *)std::ostream::operator<<(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    std::operator+(in_stack_ffffffffffffff78,
                   (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
      std::__cxx11::string::c_str();
      anon_unknown.dwarf_13deeb::writeRead
                (in_stack_00000350,in_stack_00000348,in_stack_00000344,in_stack_00000340,
                 in_stack_0000033c);
    }
    std::__cxx11::string::~string(local_60);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<Imath_3_2::half>::~Array2D(in_stack_ffffffffffffff50);
  return;
}

Assistant:

void
testLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line order and random access to scan lines" << endl;

        const int W = 117;
        const int H = 97;

        Array2D<half> ph (H, W);
        fillPixels (ph, W, H);

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            std::string filename = tempDir + "imf_test_lorder.exr";

            for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
            {
                writeRead (ph, filename.c_str (), W, H, LineOrder (lorder));
            }
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}